

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isoent_gen_iso9660_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  uint uVar1;
  void *pvVar2;
  isofile *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint weight;
  byte *__dest;
  byte *pbVar7;
  byte *__s;
  byte *pbVar8;
  char *pcVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  isoent *piVar15;
  size_t sVar16;
  int iVar17;
  size_t sVar18;
  bool bVar19;
  archive_rb_tree_ops *in_stack_ffffffffffffff58;
  uint local_9c;
  size_t local_98;
  size_t local_80;
  
  iVar6 = (isoent->children).cnt;
  iVar5 = 0;
  if (iVar6 != 0) {
    pvVar2 = a->format_data;
    uVar1 = *(uint *)((long)pvVar2 + 0x10370);
    uVar11 = uVar1 >> 0xe & 7;
    if (uVar11 < 4) {
      local_80 = 0x1e;
      if (uVar11 == 1) {
        local_80 = 8;
      }
      local_9c = 0x1f;
      local_98 = 0xc;
      if (uVar11 != 1) {
        local_98 = 0x1f;
      }
      else {
        local_9c = 8;
      }
      bVar19 = (uVar1 & 4) == 0;
    }
    else {
      local_98 = 0xc1;
      if ((uVar1 & 0x1800000) == 0) {
        local_98 = 0xcf;
      }
      bVar19 = true;
      local_9c = (uint)local_98;
      local_80 = local_98;
    }
    iVar5 = idr_start(a,idr,iVar6,3,1,0x694b70,in_stack_ffffffffffffff58);
    if (-1 < iVar5) {
      piVar15 = (isoent->children).first;
      if (piVar15 != (isoent *)0x0) {
        uVar1 = (uint)local_80;
        iVar6 = (int)local_98;
        do {
          piVar3 = piVar15->file;
          sVar18 = (piVar3->basename).length;
          __dest = (byte *)malloc((long)((sVar18 << 0x20) + 0x2200000000) >> 0x20);
          if (__dest == (byte *)0x0) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          }
          else {
            sVar16 = (long)(sVar18 << 0x20) >> 0x20;
            memcpy(__dest,(piVar3->basename).s,sVar16);
            __dest[sVar16] = 0;
            piVar15->identifier = (char *)__dest;
            pbVar7 = __dest;
            if ((uVar11 < 4) && (*__dest == 0x2e)) {
              *__dest = 0x5f;
              pbVar7 = __dest + 1;
            }
            bVar10 = *pbVar7;
            if (bVar10 == 0) {
              __s = (byte *)0x0;
              pbVar14 = (byte *)0x0;
            }
            else {
              __s = (byte *)0x0;
              pbVar13 = (byte *)0x0;
              do {
                pbVar8 = __s;
                if ((char)bVar10 < '\0') {
LAB_004ca3db:
                  *pbVar7 = 0x5f;
                  pbVar14 = pbVar13;
                }
                else {
                  pbVar14 = pbVar13;
                  if (idr->char_map[bVar10] == '\0') {
                    if ((byte)(bVar10 + 0x9f) < 0x1a) {
                      *pbVar7 = bVar10 - 0x20;
                    }
                    else if ((uVar11 < 4) || (pbVar14 = __s, pbVar8 = pbVar7, bVar10 != 0x2e)) {
                      pbVar8 = __s;
                      if (bVar10 == 0x2e) {
                        pbVar8 = pbVar7;
                        pbVar13 = __s;
                      }
                      goto LAB_004ca3db;
                    }
                  }
                  else if (bVar10 == 0x2e) {
                    pbVar14 = __s;
                    pbVar8 = pbVar7;
                  }
                }
                __s = pbVar8;
                bVar10 = pbVar7[1];
                pbVar7 = pbVar7 + 1;
                pbVar13 = pbVar14;
              } while (bVar10 != 0);
            }
            pcVar9 = piVar15->identifier;
            iVar5 = (int)sVar18;
            if (__s == (byte *)0x0) {
              uVar4 = local_9c;
              if ((piVar15->field_0xe8 & 2) == 0) {
                uVar4 = uVar1;
              }
              weight = 0xffffffff;
              if ((int)uVar4 < iVar5) {
                pcVar9[uVar4] = '\0';
                weight = uVar4;
LAB_004ca559:
                sVar18 = (size_t)uVar4;
              }
            }
            else {
              *__s = 0x2e;
              uVar12 = (long)__s - (long)pcVar9;
              if ((*(uint *)((long)pvVar2 + 0x10370) & 0x1c000) == 0x4000) {
                if ((long)uVar12 < 9) {
                  sVar16 = strlen((char *)__s);
                  if (sVar16 < 5) goto LAB_004ca55d;
                  __s[4] = 0;
                  sVar18 = uVar12 & 0xffffffff;
                  weight = 0;
                }
                else {
                  pcVar9[8] = '.';
                  pcVar9[9] = __s[1];
                  pcVar9[10] = __s[2];
                  pcVar9[0xb] = __s[3];
                  pcVar9[0xc] = '\0';
                  sVar18 = 8;
                  weight = 8;
                }
              }
              else if ((piVar15->field_0xe8 & 2) == 0) {
                sVar18 = uVar12 & 0xffffffff;
                weight = 0xffffffff;
                if (iVar6 < iVar5) {
                  sVar16 = strlen((char *)__s);
                  iVar5 = (int)pbVar14 - (int)pcVar9;
                  if (pbVar14 == (byte *)0x0) {
                    iVar5 = 0;
                  }
                  iVar17 = (int)sVar16;
                  if ((iVar17 < 2) || ((int)(uVar1 - 1) <= iVar5)) {
                    pcVar9[local_80] = '\0';
                    sVar18 = local_80;
                    weight = uVar1;
                  }
                  else {
                    iVar5 = iVar17;
                    if (iVar6 < iVar17) {
                      iVar5 = iVar6;
                    }
                    weight = iVar6 - iVar5;
                    if (iVar6 <= iVar17) {
                      weight = 1;
                    }
                    memmove(pcVar9 + (int)weight,__s,(ulong)(iVar5 - (uint)(iVar6 <= iVar17)));
                    pcVar9[local_98] = '\0';
                    sVar18 = (ulong)weight;
                  }
                }
              }
              else {
                if ((int)local_9c < iVar5) {
                  pcVar9[local_9c] = '\0';
                  weight = local_9c;
                  uVar4 = (uint)uVar12;
                  if ((int)local_9c < (int)(uint)uVar12) {
                    uVar4 = local_9c;
                  }
                  goto LAB_004ca559;
                }
LAB_004ca55d:
                sVar18 = uVar12 & 0xffffffff;
                weight = 0xffffffff;
              }
            }
            iVar17 = (int)sVar18;
            piVar15->ext_off = iVar17;
            sVar16 = strlen(pcVar9 + iVar17);
            piVar15->ext_len = (int)sVar16;
            iVar5 = (int)sVar16 + iVar17;
            piVar15->id_len = iVar5;
            if ((*(uint *)((long)pvVar2 + 0x10370) & 0x1c000) == 0x4000) {
              if (4 < iVar17) {
                iVar17 = 5;
              }
            }
            else if (iVar5 == iVar6) {
              iVar17 = iVar17 + -3;
            }
            else if (iVar5 == iVar6 + -1) {
              iVar17 = iVar17 + -2;
            }
            else {
              iVar17 = iVar17 - (uint)(iVar5 == iVar6 + -2);
            }
            idr_register(idr,piVar15,weight,iVar17);
          }
          if (__dest == (byte *)0x0) {
            return -0x1e;
          }
          piVar15 = piVar15->chnext;
        } while (piVar15 != (isoent *)0x0);
      }
      idr_resolve(idr,idr_set_num);
      iVar5 = 0;
      for (piVar15 = (isoent->children).first; piVar15 != (isoent *)0x0; piVar15 = piVar15->chnext)
      {
        if (((piVar15->field_0xe8 & 2) == 0) && (piVar15->rr_child == (isoent *)0x0)) {
          pcVar9 = piVar15->identifier + (long)piVar15->ext_len + (long)piVar15->ext_off;
          if ((uVar11 < 4) && (piVar15->ext_len == 0)) {
            *pcVar9 = '.';
            pcVar9 = pcVar9 + 1;
            piVar15->ext_len = 1;
          }
          if ((3 < uVar11) && (piVar15->ext_len == 1)) {
            pcVar9[-1] = '\0';
            pcVar9 = pcVar9 + -1;
            piVar15->ext_len = 0;
          }
          piVar15->id_len = piVar15->ext_len + piVar15->ext_off;
          if (!bVar19) {
            pcVar9[0] = ';';
            pcVar9[1] = '1';
            pcVar9 = pcVar9 + 2;
            piVar15->id_len = piVar15->id_len + 2;
          }
          *pcVar9 = '\0';
        }
        else {
          piVar15->id_len = piVar15->ext_len + piVar15->ext_off;
        }
        piVar15->mb_len = piVar15->id_len;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
isoent_gen_iso9660_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	char *p;
	int l, r;
	const char *char_map;
	char allow_ldots, allow_multidot, allow_period, allow_vernum;
	int fnmax, ffmax, dnmax;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_iso9660, isoent_cmp_key_iso9660
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	char_map = idr->char_map;
	if (iso9660->opt.iso_level <= 3) {
		allow_ldots = 0;
		allow_multidot = 0;
		allow_period = 1;
		allow_vernum = iso9660->opt.allow_vernum;
		if (iso9660->opt.iso_level == 1) {
			fnmax = 8;
			ffmax = 12;/* fnmax + '.' + 3 */
			dnmax = 8;
		} else {
			fnmax = 30;
			ffmax = 31;
			dnmax = 31;
		}
	} else {
		allow_ldots = allow_multidot = 1;
		allow_period = allow_vernum = 0;
		if (iso9660->opt.rr)
			/*
			 * MDR : The maximum size of Directory Record(254).
			 * DRL : A Directory Record Length(33).
			 * CE  : A size of SUSP CE System Use Entry(28).
			 * MDR - DRL - CE = 254 - 33 - 28 = 193.
			 */
			fnmax = ffmax = dnmax = 193;
		else
			/*
			 * XA  : CD-ROM XA System Use Extension
			 *       Information(14).
			 * MDR - DRL - XA = 254 - 33 -14 = 207.
			 */
			fnmax = ffmax = dnmax = 207;
	}

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 3, 1, &rb_ops);
	if (r < 0)
		return (r);

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		char *dot, *xdot;
		int ext_off, noff, weight;

		l = (int)np->file->basename.length;
		p = malloc(l+31+2+1);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename.s, l);
		p[l] = '\0';
		np->identifier = p;

		dot = xdot = NULL;
		if (!allow_ldots) {
			/*
			 * If there is a '.' character at the first byte,
			 * it has to be replaced by '_' character.
			 */
			if (*p == '.')
				*p++ = '_';
		}
		for (;*p; p++) {
			if (*p & 0x80) {
				*p = '_';
				continue;
			}
			if (char_map[(unsigned char)*p]) {
				/* if iso-level is '4', a character '.' is
				 * allowed by char_map. */
				if (*p == '.') {
					xdot = dot;
					dot = p;
				}
				continue;
			}
			if (*p >= 'a' && *p <= 'z') {
				*p -= 'a' - 'A';
				continue;
			}
			if (*p == '.') {
				xdot = dot;
				dot = p;
				if (allow_multidot)
					continue;
			}
			*p = '_';
		}
		p = np->identifier;
		weight = -1;
		if (dot == NULL) {
			int nammax;

			if (np->dir)
				nammax = dnmax;
			else
				nammax = fnmax;

			if (l > nammax) {
				p[nammax] = '\0';
				weight = nammax;
				ext_off = nammax;
			} else
				ext_off = l;
		} else {
			*dot = '.';
			ext_off = (int)(dot - p);

			if (iso9660->opt.iso_level == 1) {
				if (dot - p <= 8) {
					if (strlen(dot) > 4) {
						/* A length of a file extension
						 * must be less than 4 */
						dot[4] = '\0';
						weight = 0;
					}
				} else {
					p[8] = dot[0];
					p[9] = dot[1];
					p[10] = dot[2];
					p[11] = dot[3];
					p[12] = '\0';
					weight = 8;
					ext_off = 8;
				}
			} else if (np->dir) {
				if (l > dnmax) {
					p[dnmax] = '\0';
					weight = dnmax;
					if (ext_off > dnmax)
						ext_off = dnmax;
				}
			} else if (l > ffmax) {
				int extlen = (int)strlen(dot);
				int xdoff;

				if (xdot != NULL)
					xdoff = (int)(xdot - p);
				else
					xdoff = 0;

				if (extlen > 1 && xdoff < fnmax-1) {
					int off;

					if (extlen > ffmax)
						extlen = ffmax;
					off = ffmax - extlen;
					if (off == 0) {
						/* A dot('.')  character
						 * doesn't place to the first
						 * byte of identifier. */
						off ++;
						extlen --;
					}
					memmove(p+off, dot, extlen);
					p[ffmax] = '\0';
					ext_off = off;
					weight = off;
#ifdef COMPAT_MKISOFS
				} else if (xdoff >= fnmax-1) {
					/* Simulate a bug(?) of mkisofs. */
					p[fnmax-1] = '\0';
					ext_off = fnmax-1;
					weight = fnmax-1;
#endif
				} else {
					p[fnmax] = '\0';
					ext_off = fnmax;
					weight = fnmax;
				}
			}
		}
		/* Save an offset of a file name extension to sort files. */
		np->ext_off = ext_off;
		np->ext_len = (int)strlen(&p[ext_off]);
		np->id_len = l = ext_off + np->ext_len;

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if (iso9660->opt.iso_level == 1) {
			if (ext_off >= 5)
				noff = 5;
			else
				noff = ext_off;
		} else {
			if (l == ffmax)
				noff = ext_off - 3;
			else if (l == ffmax-1)
				noff = ext_off - 2;
			else if (l == ffmax-2)
				noff = ext_off - 1;
			else
				noff = ext_off;
		}
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier. */
	idr_resolve(idr, idr_set_num);

	/* Add a period and a version number to identifiers. */
	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		if (!np->dir && np->rr_child == NULL) {
			p = np->identifier + np->ext_off + np->ext_len;
			if (np->ext_len == 0 && allow_period) {
				*p++ = '.';
				np->ext_len = 1;
			}
			if (np->ext_len == 1 && !allow_period) {
				*--p = '\0';
				np->ext_len = 0;
			}
			np->id_len = np->ext_off + np->ext_len;
			if (allow_vernum) {
				*p++ = ';';
				*p++ = '1';
				np->id_len += 2;
			}
			*p = '\0';
		} else
			np->id_len = np->ext_off + np->ext_len;
		np->mb_len = np->id_len;
	}
	return (ARCHIVE_OK);
}